

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.hpp
# Opt level: O0

void __thiscall glu::InterfaceVariableInfo::InterfaceVariableInfo(InterfaceVariableInfo *this)

{
  InterfaceVariableInfo *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->index = 0xffffffff;
  this->blockIndex = 0xffffffff;
  this->atomicCounterBufferIndex = 0xffffffff;
  this->type = 0;
  this->arraySize = 0;
  this->offset = 0;
  this->arrayStride = 0;
  this->matrixStride = 0;
  this->topLevelArraySize = 0;
  this->topLevelArrayStride = 0;
  this->isRowMajor = false;
  return;
}

Assistant:

InterfaceVariableInfo (void)
		: index						(~0u /* GL_INVALID_INDEX */)
		, blockIndex				(~0u /* GL_INVALID_INDEX */)
		, atomicCounterBufferIndex	(~0u /* GL_INVALID_INDEX */)
		, type						(0)
		, arraySize					(0)
		, offset					(0)
		, arrayStride				(0)
		, matrixStride				(0)
		, topLevelArraySize			(0)
		, topLevelArrayStride		(0)
		, isRowMajor				(0)
	{
	}